

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_PrintQue(Dam_Man_t *p)

{
  int iVar1;
  int Lit;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  float fVar5;
  int iLit1;
  int iLit0;
  int i;
  Dam_Man_t *p_local;
  
  printf("Divisor queue: \n");
  iLit1 = 1;
  while( true ) {
    iVar1 = Hash_IntManEntryNum(p->vHash);
    if (iVar1 < iLit1) break;
    iVar1 = Hash_IntObjData0(p->vHash,iLit1);
    Lit = Hash_IntObjData1(p->vHash,iLit1);
    printf("Div %7d : ",(ulong)(uint)iLit1);
    fVar5 = Vec_FltEntry(p->vCounts,iLit1);
    printf("Weight %9.2f  ",(double)fVar5);
    iVar2 = Abc_LitIsCompl(iVar1);
    uVar3 = 0x20;
    if (iVar2 != 0) {
      uVar3 = 0x21;
    }
    iVar1 = Abc_Lit2Var(iVar1);
    printf("F = %c%c ",(ulong)uVar3,(ulong)(iVar1 + 0x60));
    iVar1 = Hash_IntObjData0(p->vHash,iLit1);
    iVar2 = Hash_IntObjData1(p->vHash,iLit1);
    uVar4 = 0x2b;
    if (iVar1 < iVar2) {
      uVar4 = 0x2a;
    }
    printf("%c ",uVar4);
    iVar1 = Abc_LitIsCompl(Lit);
    uVar3 = 0x20;
    if (iVar1 != 0) {
      uVar3 = 0x21;
    }
    iVar1 = Abc_Lit2Var(Lit);
    printf("%c%c   ",(ulong)uVar3,(ulong)(iVar1 + 0x60));
    printf("\n");
    iLit1 = iLit1 + 1;
  }
  return;
}

Assistant:

void Dam_PrintQue( Dam_Man_t * p )
{
    int i;
    printf( "Divisor queue: \n" );
    for ( i = 1; i <= Hash_IntManEntryNum(p->vHash); i++ )
    {
        int iLit0 = Hash_IntObjData0(p->vHash, i);
        int iLit1 = Hash_IntObjData1(p->vHash, i);
        printf( "Div %7d : ",     i );
        printf( "Weight %9.2f  ", Vec_FltEntry(p->vCounts, i) );
        printf( "F = %c%c ",      Abc_LitIsCompl(iLit0) ? '!': ' ', 'a' + Abc_Lit2Var(iLit0)-1 );
        printf( "%c ",            (Hash_IntObjData0(p->vHash, i) < Hash_IntObjData1(p->vHash, i)) ? '*':'+' );
        printf( "%c%c   ",        Abc_LitIsCompl(iLit1) ? '!': ' ', 'a' + Abc_Lit2Var(iLit1)-1 );
        printf( "\n" );
    }
}